

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O0

cmListFileContext *
cmListFileContext::FromListFileFunction
          (cmListFileContext *__return_storage_ptr__,cmListFileFunction *lff,string *fileName,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *deferId)

{
  long lVar1;
  string *psVar2;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *deferId_local;
  string *fileName_local;
  cmListFileFunction *lff_local;
  cmListFileContext *lfc;
  
  cmListFileContext(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->FilePath,(string *)fileName);
  lVar1 = cmListFileFunction::Line(lff);
  __return_storage_ptr__->Line = lVar1;
  psVar2 = cmListFileFunction::OriginalName_abi_cxx11_(lff);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psVar2);
  std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator=(&__return_storage_ptr__->DeferId,deferId);
  return __return_storage_ptr__;
}

Assistant:

static cmListFileContext FromListFileFunction(
    cmListFileFunction const& lff, std::string const& fileName,
    cm::optional<std::string> deferId = {})
  {
    cmListFileContext lfc;
    lfc.FilePath = fileName;
    lfc.Line = lff.Line();
    lfc.Name = lff.OriginalName();
    lfc.DeferId = std::move(deferId);
    return lfc;
  }